

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxIn
          (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          Privkey *blinding_key,Privkey *token_blinding_key)

{
  ByteData *this_00;
  ByteData256 *this_01;
  ByteData256 *this_02;
  ByteData *this_03;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  uint8_t uVar1;
  bool bVar2;
  uint32_t vout;
  _func_int **pp_Var3;
  size_t sVar4;
  _func_int **pp_Var5;
  pointer puVar6;
  void *pvVar7;
  CfdException *this_04;
  ulong uVar8;
  pointer puVar9;
  size_t sVar10;
  _func_int **__src;
  pointer in_stack_fffffffffffffaa0;
  ByteData local_558;
  Privkey *local_540;
  UnblindParameter local_538;
  uint32_t local_4a0;
  uint32_t tx_in_index_local;
  void *local_498;
  void *pvStack_490;
  long local_488;
  ByteData256 local_478;
  ByteData256 local_458;
  void *local_438;
  void *pvStack_430;
  long local_428;
  UnblindParameter token_unblind;
  ConfidentialValue local_380;
  UnblindParameter asset_unblind;
  ConfidentialValue local_2b0;
  ConfidentialValue local_288;
  ConfidentialValue local_260;
  Script local_238;
  ConfidentialTxIn tx_in;
  IssuanceParameter issue;
  
  local_540 = blinding_key;
  tx_in_index_local = tx_in_index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0xb0d,"UnblindTxIn");
  local_4a0 = tx_in_index;
  ConfidentialTxIn::ConfidentialTxIn
            (&tx_in,(this->vin_).
                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_start + tx_in_index);
  ConfidentialValue::ConfidentialValue((ConfidentialValue *)&asset_unblind,&tx_in.issuance_amount_);
  if (asset_unblind.asset.version_ < 2) {
    ConfidentialValue::ConfidentialValue(&local_260,&tx_in.inflation_keys_);
    bVar2 = true;
    if (1 < local_260.version_) goto LAB_0047336b;
  }
  else {
LAB_0047336b:
    token_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar8 = (long)tx_in.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      pp_Var3 = (_func_int **)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var3 = (_func_int **)operator_new(uVar8);
      sVar10 = (long)tx_in.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(uVar8 + (long)pp_Var3);
    token_unblind.asset._vptr_ConfidentialAssetId = pp_Var3;
    if (tx_in.issuance_amount_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        tx_in.issuance_amount_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      token_unblind.asset.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pp_Var3;
      memmove(pp_Var3,tx_in.issuance_amount_rangeproof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((long)pp_Var3 + sVar10);
    sVar4 = ByteData::GetDataSize((ByteData *)&token_unblind);
    if (sVar4 == 0) {
      local_538.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar8 = (long)tx_in.inflation_keys_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)tx_in.inflation_keys_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar8 == 0) {
        pp_Var3 = (_func_int **)0x0;
        sVar10 = 0;
      }
      else {
        if ((long)uVar8 < 0) {
          ::std::__throw_bad_alloc();
        }
        pp_Var3 = (_func_int **)operator_new(uVar8);
        sVar10 = (long)tx_in.inflation_keys_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)tx_in.inflation_keys_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar8 + (long)pp_Var3);
      local_538.asset._vptr_ConfidentialAssetId = pp_Var3;
      if (tx_in.inflation_keys_rangeproof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          tx_in.inflation_keys_rangeproof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_538.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pp_Var3;
        memmove(pp_Var3,tx_in.inflation_keys_rangeproof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,sVar10);
      }
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)((long)pp_Var3 + sVar10);
      sVar4 = ByteData::GetDataSize((ByteData *)&local_538);
      bVar2 = sVar4 == 0;
      if (local_538.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
        operator_delete(local_538.asset._vptr_ConfidentialAssetId);
      }
    }
    else {
      bVar2 = false;
    }
    if (token_unblind.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      operator_delete(token_unblind.asset._vptr_ConfidentialAssetId);
    }
    if (1 < asset_unblind.asset.version_) goto LAB_004734ed;
  }
  local_260._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if (local_260.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_004734ed:
  asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if ((void *)CONCAT44(asset_unblind.asset.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       asset_unblind.asset.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(asset_unblind.asset.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     asset_unblind.asset.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (!bVar2) {
    AbstractTxIn::GetTxid((Txid *)&asset_unblind,&tx_in.super_AbstractTxIn);
    vout = AbstractTxIn::GetVout(&tx_in.super_AbstractTxIn);
    token_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar8 = (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      pp_Var3 = (_func_int **)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var3 = (_func_int **)operator_new(uVar8);
      sVar10 = (long)tx_in.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(uVar8 + (long)pp_Var3);
    token_unblind.asset._vptr_ConfidentialAssetId = pp_Var3;
    if (tx_in.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        tx_in.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      token_unblind.asset.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pp_Var3;
      memmove(pp_Var3,tx_in.asset_entropy_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((long)pp_Var3 + sVar10);
    local_538.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar8 = (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      pp_Var3 = (_func_int **)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var3 = (_func_int **)operator_new(uVar8);
      sVar10 = (long)tx_in.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar8 + (long)pp_Var3);
    local_538.asset._vptr_ConfidentialAssetId = pp_Var3;
    if (tx_in.blinding_nonce_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        tx_in.blinding_nonce_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pp_Var3;
      memmove(pp_Var3,tx_in.blinding_nonce_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)((long)pp_Var3 + sVar10);
    CalculateIssuanceValue
              (&issue,(Txid *)&asset_unblind,vout,true,(ByteData256 *)&token_unblind,
               (ByteData256 *)&local_538);
    if (local_538.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      operator_delete(local_538.asset._vptr_ConfidentialAssetId);
    }
    if (token_unblind.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      operator_delete(token_unblind.asset._vptr_ConfidentialAssetId);
    }
    asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__Txid_00678d28;
    if ((void *)CONCAT44(asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar8 = (long)tx_in.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      pp_Var3 = (_func_int **)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var3 = (_func_int **)operator_new(uVar8);
      sVar10 = (long)tx_in.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(uVar8 + (long)pp_Var3);
    local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pp_Var3;
    if (tx_in.issuance_amount_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        tx_in.issuance_amount_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pp_Var3;
      memmove(pp_Var3,tx_in.issuance_amount_rangeproof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)((long)pp_Var3 + sVar10);
    uVar8 = (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      pp_Var3 = (_func_int **)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var3 = (_func_int **)operator_new(uVar8);
      sVar10 = (long)tx_in.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    puVar9 = (pointer)(uVar8 + (long)pp_Var3);
    __src = pp_Var3;
    if (tx_in.inflation_keys_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        tx_in.inflation_keys_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(pp_Var3,tx_in.inflation_keys_rangeproof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    pp_Var3 = (_func_int **)((long)pp_Var3 + sVar10);
    this_00 = &asset_unblind.asset.data_;
    asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228
    ;
    ByteData::ByteData(this_00);
    this_01 = &asset_unblind.abf.data_;
    asset_unblind.asset.version_ = '\0';
    asset_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    ByteData256::ByteData256(this_01);
    this_02 = &asset_unblind.vbf.data_;
    asset_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    ByteData256::ByteData256(this_02);
    this_03 = &asset_unblind.value.data_;
    asset_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    ByteData::ByteData(this_03);
    asset_unblind.value.version_ = '\0';
    token_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228
    ;
    ByteData::ByteData(&token_unblind.asset.data_);
    token_unblind.asset.version_ = '\0';
    token_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    ByteData256::ByteData256(&token_unblind.abf.data_);
    token_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    ByteData256::ByteData256(&token_unblind.vbf.data_);
    token_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    ByteData::ByteData(&token_unblind.value.data_);
    token_unblind.value.version_ = '\0';
    ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_538,&tx_in.issuance_amount_);
    uVar1 = local_538.asset.version_;
    local_538.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if ((_func_int **)
        local_538.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_538.asset.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (1 < uVar1) {
      ConfidentialValue::ConfidentialValue(&local_380,&tx_in.issuance_amount_);
      Script::Script(&local_238);
      CalculateUnblindIssueData(&local_538,local_540,&local_558,&local_380,&local_238,&issue.asset);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_00->data_,&local_538.asset.data_.data_);
      asset_unblind.asset.version_ = local_538.asset.version_;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_01->data_,&local_538.abf.data_.data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_02->data_,&local_538.vbf.data_.data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_03->data_,&local_538.value.data_.data_);
      asset_unblind.value.version_ = local_538.value.version_;
      local_538.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      if (local_538.value.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_538.value.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_538.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
      if (local_538.vbf.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_538.vbf.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_538.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
      if (local_538.abf.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_538.abf.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_538.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
      if ((_func_int **)
          local_538.asset.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (_func_int **)0x0) {
        operator_delete(local_538.asset.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Script::~Script(&local_238);
      local_380._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      if (local_380.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ByteData::ByteData((ByteData *)&local_538);
      puVar6 = local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_538.asset._vptr_ConfidentialAssetId;
      local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_538.asset.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_538.asset.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_538.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((_func_int **)puVar6 != (_func_int **)0x0) {
        operator_delete(puVar6);
        if (local_538.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
          operator_delete(local_538.asset._vptr_ConfidentialAssetId);
        }
      }
    }
    local_538.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar8 = (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      pp_Var5 = (_func_int **)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var5 = (_func_int **)operator_new(uVar8);
      sVar10 = (long)tx_in.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar8 + (long)pp_Var5);
    local_538.asset._vptr_ConfidentialAssetId = pp_Var5;
    if (tx_in.inflation_keys_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        tx_in.inflation_keys_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pp_Var5;
      memmove(pp_Var5,tx_in.inflation_keys_rangeproof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    local_538.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)((long)pp_Var5 + sVar10);
    sVar4 = ByteData::GetDataSize((ByteData *)&local_538);
    if (local_538.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      operator_delete(local_538.asset._vptr_ConfidentialAssetId);
    }
    if (sVar4 != 0) {
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_538,&tx_in.inflation_keys_);
      uVar1 = local_538.asset.version_;
      local_538.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      if ((_func_int **)
          local_538.asset.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (_func_int **)0x0) {
        operator_delete(local_538.asset.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (1 < uVar1) {
        bVar2 = Privkey::IsValid(token_blinding_key);
        if (bVar2) {
          local_540 = token_blinding_key;
        }
        ConfidentialValue::ConfidentialValue(&local_380,&tx_in.inflation_keys_);
        Script::Script(&local_238);
        CalculateUnblindIssueData
                  (&local_538,local_540,(ByteData *)&stack0xfffffffffffffa88,&local_380,&local_238,
                   &issue.token);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.asset.data_.data_,&local_538.asset.data_.data_);
        token_unblind.asset.version_ = local_538.asset.version_;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.abf.data_.data_,&local_538.abf.data_.data_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.vbf.data_.data_,&local_538.vbf.data_.data_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.value.data_.data_,&local_538.value.data_.data_);
        token_unblind.value.version_ = local_538.value.version_;
        local_538.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
        pp_Var5 = __src;
        if (local_538.value.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_538.value.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
          pp_Var5 = __src;
        }
        local_538.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
        if (local_538.vbf.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_538.vbf.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_538.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
        if (local_538.abf.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_538.abf.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_538.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228
        ;
        if ((_func_int **)
            local_538.asset.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (_func_int **)0x0) {
          operator_delete(local_538.asset.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Script::~Script(&local_238);
        local_380._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
        if (local_380.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_380.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ByteData::ByteData((ByteData *)&local_538);
        puVar9 = local_538.asset.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pp_Var3 = (_func_int **)
                  local_538.asset.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __src = local_538.asset._vptr_ConfidentialAssetId;
        local_538.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
        local_538.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_538.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pp_Var5 != (_func_int **)0x0) {
          operator_delete(pp_Var5);
          if (local_538.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
            operator_delete(local_538.asset._vptr_ConfidentialAssetId);
          }
        }
      }
    }
    local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar8 = (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      puVar6 = (pointer)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar6 = (pointer)operator_new(uVar8);
      sVar10 = (long)tx_in.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6 + uVar8;
    local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    if (tx_in.blinding_nonce_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        tx_in.blinding_nonce_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      memmove(puVar6,tx_in.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6 + sVar10;
    local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar8 = (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      puVar6 = (pointer)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar6 = (pointer)operator_new(uVar8);
      sVar10 = (long)tx_in.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tx_in.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6 + uVar8;
    local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    if (tx_in.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        tx_in.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      memmove(puVar6,tx_in.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6 + sVar10;
    ConfidentialValue::ConfidentialValue(&local_288,&asset_unblind.value);
    ConfidentialValue::ConfidentialValue(&local_2b0,&token_unblind.value);
    local_498 = (void *)0x0;
    pvStack_490 = (void *)0x0;
    local_488 = 0;
    uVar8 = (long)local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar8 == 0) {
      pvVar7 = (void *)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pvVar7 = operator_new(uVar8);
      sVar10 = (long)local_558.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_558.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_488 = uVar8 + (long)pvVar7;
    local_498 = pvVar7;
    if (local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pvStack_490 = pvVar7;
      memmove(pvVar7,local_558.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    pvStack_490 = (void *)((long)pvVar7 + sVar10);
    local_438 = (void *)0x0;
    pvStack_430 = (void *)0x0;
    local_428 = 0;
    uVar8 = (long)pp_Var3 - (long)__src;
    if (uVar8 == 0) {
      pvVar7 = (void *)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        ::std::__throw_bad_alloc();
      }
      pvVar7 = operator_new(uVar8);
      sVar10 = (long)pp_Var3 - (long)__src;
    }
    local_428 = uVar8 + (long)pvVar7;
    local_438 = pvVar7;
    if (pp_Var3 != __src) {
      pvStack_430 = pvVar7;
      memmove(pvVar7,__src,sVar10);
    }
    pvStack_430 = (void *)((long)pvVar7 + sVar10);
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_438;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_498;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)__src;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar9;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pp_Var3;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffaa0;
    SetIssuance(this,local_4a0,&local_458,&local_478,&local_288,&local_2b0,
                issuance_amount_rangeproof,inflation_keys_rangeproof);
    if (local_438 != (void *)0x0) {
      operator_delete(local_438);
    }
    if (local_498 != (void *)0x0) {
      operator_delete(local_498);
    }
    local_2b0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if (local_2b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_288._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if (local_288.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_478.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_478.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_458.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_458.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,&asset_unblind);
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,&token_unblind);
    token_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if (token_unblind.value.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.value.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    token_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    if (token_unblind.vbf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.vbf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    token_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    if (token_unblind.abf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.abf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    token_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228
    ;
    if (token_unblind.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.asset.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if (asset_unblind.value.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_unblind.value.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    if (asset_unblind.vbf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_unblind.vbf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    if (asset_unblind.abf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_unblind.abf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228
    ;
    if ((void *)CONCAT44(asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (__src != (_func_int **)0x0) {
      operator_delete(__src);
    }
    if ((_func_int **)
        local_558.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_558.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    issue.token._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
    if (issue.token.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(issue.token.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    issue.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
    if (issue.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(issue.asset.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    issue.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    if (issue.entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(issue.entropy.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ConfidentialTxIn::~ConfidentialTxIn(&tx_in);
    return __return_storage_ptr__;
  }
  asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)0x5894d1;
  asset_unblind.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb15;
  asset_unblind.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "UnblindTxIn";
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)&asset_unblind,kCfdLogLevelWarning,
             "Failed to unblind TxIn. Target TxIn already unblinded.: tx_in_index=[{}]",
             &tx_in_index_local);
  this_04 = (CfdException *)__cxa_allocate_exception(0x30);
  asset_unblind.asset._vptr_ConfidentialAssetId =
       (_func_int **)
       &asset_unblind.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&asset_unblind,"Failed to unblind TxIn. Target TxIn already unblinded.","");
  CfdException::CfdException(this_04,kCfdIllegalStateError,(string *)&asset_unblind);
  __cxa_throw(this_04,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<UnblindParameter> ConfidentialTransaction::UnblindTxIn(
    uint32_t tx_in_index, const Privkey &blinding_key,
    const Privkey token_blinding_key) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  ConfidentialTxIn tx_in(vin_[tx_in_index]);
  if (((!tx_in.GetIssuanceAmount().HasBlinding()) &&
       (!tx_in.GetInflationKeys().HasBlinding())) ||
      ((tx_in.GetIssuanceAmountRangeproof().GetDataSize() == 0) &&
       (tx_in.GetInflationKeysRangeproof().GetDataSize() == 0))) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxIn. Target TxIn already unblinded.: "
        "tx_in_index=[{}]",
        tx_in_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxIn. Target TxIn already unblinded.");
  }

  IssuanceParameter issue = CalculateIssuanceValue(
      tx_in.GetTxid(), tx_in.GetVout(), true, tx_in.GetAssetEntropy(),
      tx_in.GetBlindingNonce());

  ByteData amount_rangeproof = tx_in.GetIssuanceAmountRangeproof();
  ByteData token_rangeproof = tx_in.GetInflationKeysRangeproof();

  UnblindParameter asset_unblind;
  UnblindParameter token_unblind;

  if (tx_in.GetIssuanceAmount().HasBlinding()) {
    asset_unblind = CalculateUnblindIssueData(
        blinding_key, amount_rangeproof, tx_in.GetIssuanceAmount(), Script(),
        issue.asset);
    amount_rangeproof = ByteData();
  }

  if (tx_in.GetInflationKeysRangeproof().GetDataSize() != 0) {
    if (tx_in.GetInflationKeys().HasBlinding()) {
      token_unblind = CalculateUnblindIssueData(
          (token_blinding_key.IsValid()) ? token_blinding_key : blinding_key,
          token_rangeproof, tx_in.GetInflationKeys(), Script(), issue.token);
      token_rangeproof = ByteData();
    }
  }

  // clear and set unblind value to txin
  SetIssuance(
      tx_in_index, tx_in.GetBlindingNonce(), tx_in.GetAssetEntropy(),
      asset_unblind.value, token_unblind.value, amount_rangeproof,
      token_rangeproof);
  std::vector<UnblindParameter> result;
  result.push_back(asset_unblind);
  result.push_back(token_unblind);

  return result;
}